

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_gen.cpp
# Opt level: O2

bool __thiscall crn::corpus_gen::generate(corpus_gen *this,char *pCmd_line)

{
  file_desc *pfVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  uint y;
  int iVar5;
  int iVar6;
  uint uVar7;
  _Rb_tree_node_base *p_Var8;
  color_quad<unsigned_char,_int> *pcVar9;
  uint x;
  _Base_ptr *pp_Var10;
  ulong uVar11;
  ulong uVar12;
  uint x_1;
  ulong uVar13;
  long lVar14;
  _Base_ptr p_Var15;
  _Rb_tree_node_base *this_00;
  _Base_ptr p_Var16;
  hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
  *this_01;
  uint x_2;
  uint uVar17;
  uchar *puVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  char *pcVar22;
  char **ppcVar23;
  char *pFilename;
  uint y_1;
  long lVar24;
  float fVar25;
  uint local_230;
  uint local_228;
  uint local_224;
  uint local_220;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_218;
  uint local_214;
  uint local_210;
  uint local_20c;
  vector<unsigned_int> remaining_blocks;
  find_files file_finder;
  dynamic_string dst_filename;
  char local_1c0;
  image_u8 img;
  block_hash_map block_hash;
  command_line_params params;
  image_u8 dst_img;
  block b;
  random rm;
  
  crnlib::command_line_params::command_line_params(&params);
  bVar3 = crnlib::command_line_params::parse(&params,pCmd_line,7,generate::param_desc_array,true);
  if (bVar3) {
    bVar3 = crnlib::command_line_params::has_key(&params,"in");
    if (bVar3) {
      iVar5 = crnlib::command_line_params::get_value_as_int(&params,"width",0,0x1000,0x80,0x1000,0);
      iVar6 = crnlib::command_line_params::get_value_as_int(&params,"height",0,0x1000,0x80,0x1000,0)
      ;
      rm.m_ranctx.a = 0xff000000;
      crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                (&dst_img,iVar5 + 3U & 0xfffffffc,iVar6 + 3U & 0xfffffffc,0xffffffff,
                 (color_quad<unsigned_char,_int> *)&rm,0xf);
      crnlib::random::random(&rm);
      local_214 = iVar5 + 3U >> 2;
      uVar20 = (iVar6 + 3U >> 2) * local_214;
      this_00 = (_Rb_tree_node_base *)&block_hash;
      block_hash.m_values.m_p = (raw_node *)0x0;
      block_hash.m_values.m_size = 0;
      block_hash.m_values.m_capacity = 0;
      block_hash.m_hash_shift = 0x20;
      block_hash.m_num_valid = 0;
      block_hash.m_grow_threshold = 0;
      crnlib::
      hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
      ::reserve((hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                 *)this_00,uVar20);
      local_220 = 0;
      local_224 = 0;
      local_228 = 0;
      local_230 = 0;
      p_Var16 = params.m_param_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_210 = uVar20;
      while (bVar3 = (_Rb_tree_header *)p_Var16 ==
                     &params.m_param_map._M_t._M_impl.super__Rb_tree_header, !bVar3) {
        bVar4 = crnlib::dynamic_string::operator!=((dynamic_string *)(p_Var16 + 1),"in");
        if (!bVar4) {
          uVar17 = *(uint *)&p_Var16[1]._M_right;
          if (uVar17 == 0) {
            crnlib::console::error("Must follow /in parameter with a filename!\n");
            goto LAB_00105532;
          }
          for (uVar19 = 0; uVar19 < uVar17; uVar19 = uVar19 + 1) {
            p_Var15 = p_Var16[1]._M_left;
            file_finder.m_last_error = 0;
            file_finder.m_files.m_p = (file_desc *)0x0;
            file_finder.m_files.m_size = 0;
            file_finder.m_files.m_capacity = 0;
            pcVar22 = (char *)(&p_Var15->_M_parent)[uVar19 * 2];
            bVar4 = crnlib::command_line_params::has_key(&params,"deep");
            if ((_Base_ptr)pcVar22 == (_Base_ptr)0x0) {
              pcVar22 = "";
            }
            bVar4 = crnlib::find_files::find(&file_finder,pcVar22,bVar4 | 4);
            pp_Var10 = &p_Var15->_M_parent + uVar19 * 2;
            if (bVar4) {
              if (file_finder.m_files.m_size == 0) {
                p_Var16 = *pp_Var10;
                p_Var15 = (_Base_ptr)"";
                if (p_Var16 != (_Base_ptr)0x0) {
                  p_Var15 = p_Var16;
                }
                crnlib::console::warning("No files found: %s",p_Var15);
                crnlib::vector<crnlib::find_files::file_desc>::~vector(&file_finder.m_files);
                goto LAB_00105532;
              }
              for (uVar12 = 0; pfVar1 = file_finder.m_files.m_p, uVar12 < file_finder.m_files.m_size
                  ; uVar12 = uVar12 + 1) {
                pcVar22 = file_finder.m_files.m_p[uVar12].m_fullname.m_pStr;
                if (pcVar22 == (char *)0x0) {
                  pcVar22 = "";
                }
                crnlib::console::printf("Loading image: %s",pcVar22);
                ppcVar23 = &pfVar1[uVar12].m_fullname.m_pStr;
                img.m_width = 0;
                img.m_height = 0;
                img.m_pitch = 0;
                img.m_total = 0;
                img.m_comp_flags = 0xf;
                img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                img.m_pixel_buf.m_size = 0;
                img.m_pixel_buf.m_capacity = 0;
                pcVar22 = *ppcVar23;
                if (pcVar22 == (char *)0x0) {
                  pcVar22 = "";
                }
                bVar4 = crnlib::image_utils::read_from_file(&img,pcVar22,0);
                if (bVar4) {
                  bVar4 = crnlib::command_line_params::has_key(&params,"alpha");
                  uVar20 = img.m_width;
                  uVar2 = img.m_height;
                  if (!bVar4) {
                    for (uVar17 = 0; uVar17 < img.m_height; uVar17 = uVar17 + 1) {
                      for (uVar21 = 0; uVar21 < img.m_width; uVar21 = uVar21 + 1) {
                        img.m_pPixels[img.m_pitch * uVar17 + uVar21].field_0.field_0.a = 0xff;
                      }
                    }
                  }
                  fVar25 = crnlib::command_line_params::get_value_as_float
                                     (&params,"blockpercentage",0,0.1,0.001,1.0,0);
                  uVar17 = uVar20 + 3 >> 2;
                  uVar21 = (uVar2 + 3 >> 2) * uVar17;
                  uVar13 = (ulong)(fVar25 * (float)uVar21);
                  if ((uint)uVar13 < 2) {
                    uVar13 = 1;
                  }
                  uVar13 = uVar13 & 0xffffffff;
                  crnlib::vector<unsigned_int>::vector(&remaining_blocks,uVar21);
                  local_224 = local_224 + 1;
                  for (uVar11 = 0; uVar21 != uVar11; uVar11 = uVar11 + 1) {
                    remaining_blocks.m_p[uVar11] = (uint)uVar11;
                  }
                  while (((int)uVar13 != 0 && (remaining_blocks.m_size != 0))) {
                    uVar7 = crnlib::random::irand(&rm,0,remaining_blocks.m_size);
                    uVar21 = remaining_blocks.m_p[uVar7];
                    crnlib::vector<unsigned_int>::erase_unordered(&remaining_blocks,uVar7);
                    local_20c = uVar21 / uVar17 << 2;
                    puVar18 = &b.m_c[0].field_0.field_0.a;
                    for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
                      uVar7 = local_20c | (uint)lVar24;
                      for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                        pcVar9 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped
                                           (&img,uVar21 % uVar17 << 2 | (uint)lVar14,uVar7);
                        puVar18[lVar14 * 4 + -3] = (pcVar9->field_0).field_0.r;
                        puVar18[lVar14 * 4 + -2] = (pcVar9->field_0).field_0.g;
                        puVar18[lVar14 * 4 + -1] = (pcVar9->field_0).field_0.b;
                        puVar18[lVar14 * 4] = (pcVar9->field_0).field_0.a;
                      }
                      puVar18 = puVar18 + 0x10;
                    }
                    this_01 = (hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                               *)&dst_filename;
                    crnlib::
                    hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                    ::insert((insert_result *)this_01,&block_hash,&b,
                             (empty_type *)&local_218.field_0);
                    uVar20 = local_210;
                    if (local_1c0 != '\0') {
                      if (block_hash.m_num_valid == local_210) {
                        crnlib::
                        hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                        ::clear(&block_hash);
                        this_01 = &block_hash;
                        crnlib::
                        hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                        ::reserve(this_01,uVar20);
                      }
                      puVar18 = &b.m_c[0].field_0.field_0.a;
                      for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
                        uVar21 = local_230 / local_214 << 2 | (uint)lVar24;
                        this_01 = (hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                                   *)(ulong)uVar21;
                        for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                          uVar7 = (local_230 % local_214 << 2 | (uint)lVar14) +
                                  dst_img.m_pitch * uVar21;
                          dst_img.m_pPixels[uVar7].field_0.field_0.r = puVar18[lVar14 * 4 + -3];
                          dst_img.m_pPixels[uVar7].field_0.field_0.g = puVar18[lVar14 * 4 + -2];
                          dst_img.m_pPixels[uVar7].field_0.field_0.b = puVar18[lVar14 * 4 + -1];
                          dst_img.m_pPixels[uVar7].field_0.field_0.a = puVar18[lVar14 * 4];
                        }
                        puVar18 = puVar18 + 0x10;
                      }
                      local_230 = local_230 + 1;
                      if (uVar20 == local_230) {
                        sort_blocks((corpus_gen *)this_01,&dst_img);
                        crnlib::dynamic_string::dynamic_string
                                  (&dst_filename,cVarArg,"test_%u.tga",(ulong)local_228);
                        pcVar22 = dst_filename.m_pStr;
                        if (dst_filename.m_pStr == (char *)0x0) {
                          pcVar22 = "";
                        }
                        crnlib::console::printf("Writing image: %s",pcVar22);
                        pcVar22 = dst_filename.m_pStr;
                        if (dst_filename.m_pStr == (char *)0x0) {
                          pcVar22 = "";
                        }
                        crnlib::image_utils::write_to_file(pcVar22,&dst_img,0,-1);
                        local_218.m_u32 = 0xff000000;
                        crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::set_all
                                  (&dst_img,(color_quad<unsigned_char,_int> *)&local_218.field_0);
                        local_228 = local_228 + 1;
                        crnlib::dynamic_string::~dynamic_string(&dst_filename);
                        local_230 = 0;
                      }
                      local_220 = local_220 + 1;
                      uVar13 = (ulong)((int)uVar13 - 1);
                    }
                  }
                  crnlib::vector<unsigned_int>::~vector(&remaining_blocks);
                }
                else {
                  pcVar22 = *ppcVar23;
                  if (pcVar22 == (char *)0x0) {
                    pcVar22 = "";
                  }
                  crnlib::console::warning("Failed loading image file: %s",pcVar22);
                }
                crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&img.m_pixel_buf);
              }
            }
            else {
              pcVar22 = (char *)*pp_Var10;
              if ((_Base_ptr)pcVar22 == (_Base_ptr)0x0) {
                pcVar22 = "";
              }
              crnlib::console::warning("Failed finding files: %s",pcVar22);
            }
            crnlib::vector<crnlib::find_files::file_desc>::~vector(&file_finder.m_files);
            uVar17 = *(uint *)&p_Var16[1]._M_right;
          }
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
        this_00 = p_Var16;
        p_Var16 = p_Var8;
      }
      if (local_230 != 0) {
        sort_blocks((corpus_gen *)this_00,&dst_img);
        crnlib::dynamic_string::dynamic_string
                  ((dynamic_string *)&b,cVarArg,"test_%u.tga",(ulong)local_228);
        pFilename = "";
        pcVar22 = (char *)b.m_c._8_8_;
        if (b.m_c._8_8_ == 0) {
          pcVar22 = "";
        }
        crnlib::console::printf("Writing image: %s",pcVar22);
        if (b.m_c._8_8_ != 0) {
          pFilename = (char *)b.m_c._8_8_;
        }
        crnlib::image_utils::write_to_file(pFilename,&dst_img,0,-1);
        local_228 = local_228 + 1;
        crnlib::dynamic_string::~dynamic_string((dynamic_string *)&b);
      }
      crnlib::console::printf
                ("Found %u input images, %u output images, %u total blocks",(ulong)local_224,
                 (ulong)local_228,(ulong)local_220);
LAB_00105532:
      crnlib::
      hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
      ::~hash_map(&block_hash);
      crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&dst_img.m_pixel_buf);
    }
    else {
      bVar3 = false;
      crnlib::console::error("Must specify one or more input files using the /in option!");
    }
  }
  else {
    bVar3 = false;
  }
  crnlib::command_line_params::~command_line_params(&params);
  return bVar3;
}

Assistant:

bool corpus_gen::generate(const char* pCmd_line)
    {
        static const command_line_params::param_desc param_desc_array[] =
        {
            { "corpus_gen", 0, false },
            { "in", 1, true },
            { "deep", 0, false },
            { "blockpercentage", 1, false },
            { "width", 1, false },
            { "height", 1, false },
            { "alpha", 0, false },
        };

        command_line_params params;
        if (!params.parse(pCmd_line, CRNLIB_ARRAY_SIZE(param_desc_array), param_desc_array, true))
        {
            return false;
        }

        if (!params.has_key("in"))
        {
            console::error("Must specify one or more input files using the /in option!");
            return false;
        }

        uint num_dst_blocks_x = params.get_value_as_int("width", 0, 4096, 128, 4096);
        num_dst_blocks_x = (num_dst_blocks_x + 3) / 4;
        uint num_dst_blocks_y = params.get_value_as_int("height", 0, 4096, 128, 4096);
        num_dst_blocks_y = (num_dst_blocks_y + 3) / 4;

        const uint total_dst_blocks = num_dst_blocks_x * num_dst_blocks_y;
        image_u8 dst_img(num_dst_blocks_x * 4, num_dst_blocks_y * 4);
        uint next_dst_block = 0;
        uint total_dst_images = 0;

        crnlib::random rm;

        block_hash_map block_hash;
        block_hash.reserve(total_dst_blocks);

        uint total_images_loaded = 0;
        uint total_blocks_written = 0;

        command_line_params::param_map_const_iterator it = params.begin();
        for (; it != params.end(); ++it)
        {
            if (it->first != "in")
            {
                continue;
            }

            if (it->second.m_values.empty())
            {
                console::error("Must follow /in parameter with a filename!\n");
                return false;
            }

            for (uint in_value_index = 0; in_value_index < it->second.m_values.size(); in_value_index++)
            {
                const dynamic_string& filespec = it->second.m_values[in_value_index];

                find_files file_finder;
                if (!file_finder.find(filespec.get_ptr(), find_files::cFlagAllowFiles | (params.has_key("deep") ? find_files::cFlagRecursive : 0)))
                {
                    console::warning("Failed finding files: %s", filespec.get_ptr());
                    continue;
                }

                if (file_finder.get_files().empty())
                {
                    console::warning("No files found: %s", filespec.get_ptr());
                    return false;
                }

                const find_files::file_desc_vec& files = file_finder.get_files();

                for (uint file_index = 0; file_index < files.size(); file_index++)
                {
                    const find_files::file_desc& file_desc = files[file_index];

                    console::printf("Loading image: %s", file_desc.m_fullname.get_ptr());

                    image_u8 img;
                    if (!image_utils::read_from_file(img, file_desc.m_fullname.get_ptr(), 0))
                    {
                        console::warning("Failed loading image file: %s", file_desc.m_fullname.get_ptr());
                        continue;
                    }

                    if (!params.has_key("alpha"))
                    {
                        for (uint y = 0; y < img.get_height(); y++)
                        {
                            for (uint x = 0; x < img.get_width(); x++)
                            {
                                img(x, y).a = 255;
                            }
                        }
                    }

                    total_images_loaded++;

                    uint width = img.get_width();
                    uint height = img.get_height();

                    uint num_blocks_x = (width + 3) / 4;
                    uint num_blocks_y = (height + 3) / 4;
                    uint total_blocks = num_blocks_x * num_blocks_y;

                    float percentage = params.get_value_as_float("blockpercentage", 0, .1f, .001f, 1.0f);
                    uint total_rand_blocks = math::maximum<uint>(1U, (uint)(total_blocks * percentage));

                    crnlib::vector<uint> remaining_blocks(total_blocks);
                    for (uint i = 0; i < total_blocks; i++)
                    {
                        remaining_blocks[i] = i;
                    }

                    uint num_blocks_remaining = total_rand_blocks;
                    while (num_blocks_remaining)
                    {
                        if (remaining_blocks.empty())
                        {
                            break;
                        }

                        uint rand_block_index = rm.irand(0, remaining_blocks.size());
                        uint block_index = remaining_blocks[rand_block_index];
                        remaining_blocks.erase_unordered(rand_block_index);

                        uint block_y = block_index / num_blocks_x;
                        uint block_x = block_index % num_blocks_x;

                        block b;

                        for (uint y = 0; y < 4; y++)
                        {
                            for (uint x = 0; x < 4; x++)
                            {
                                b.m_c[x + y * 4] = img.get_clamped(block_x * 4 + x, block_y * 4 + y);
                            }
                        }

                        if (!block_hash.insert(b).second)
                        {
                            continue;
                        }
                        if (block_hash.size() == total_dst_blocks)
                        {
                            block_hash.clear();
                            block_hash.reserve(total_dst_blocks);
                        }

                        uint dst_block_x = next_dst_block % num_dst_blocks_x;
                        uint dst_block_y = next_dst_block / num_dst_blocks_x;
                        for (uint y = 0; y < 4; y++)
                        {
                            for (uint x = 0; x < 4; x++)
                            {
                                dst_img(dst_block_x * 4 + x, dst_block_y * 4 + y) = b.m_c[x + y * 4];
                            }
                        }

                        next_dst_block++;
                        if (total_dst_blocks == next_dst_block)
                        {
                            sort_blocks(dst_img);

                            dynamic_string dst_filename(cVarArg, "test_%u.tga", total_dst_images);
                            console::printf("Writing image: %s", dst_filename.get_ptr());
                            image_utils::write_to_file(dst_filename.get_ptr(), dst_img, 0);

                            dst_img.set_all(color_quad_u8::make_black());

                            next_dst_block = 0;

                            total_dst_images++;
                        }

                        total_blocks_written++;

                        num_blocks_remaining--;
                    }
                } // file_index
            } // in_value_index
        }

        if (next_dst_block)
        {
            sort_blocks(dst_img);

            dynamic_string dst_filename(cVarArg, "test_%u.tga", total_dst_images);
            console::printf("Writing image: %s", dst_filename.get_ptr());
            image_utils::write_to_file(dst_filename.get_ptr(), dst_img, 0);

            next_dst_block = 0;

            total_dst_images++;
        }

        console::printf("Found %u input images, %u output images, %u total blocks", total_images_loaded, total_dst_images, total_blocks_written);

        return true;
    }